

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int get_response(mg_connection *conn,char *ebuf,size_t ebuf_len,int *err)

{
  mg_header *hdr;
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  ushort *puVar6;
  long lVar7;
  longlong lVar8;
  uint buflen;
  byte *pbVar9;
  char *pcVar10;
  char *endptr;
  char *local_50;
  size_t local_48;
  int *local_40;
  char *local_38;
  
  conn->connection_type = 2;
  iVar2 = get_message(conn,ebuf,ebuf_len,err);
  if (iVar2 == 0) {
    return 0;
  }
  pbVar9 = (byte *)conn->buf;
  uVar3 = conn->buf_size;
  (conn->response_info).status_code = 0;
  (conn->response_info).num_headers = 0;
  (conn->response_info).status_text = (char *)0x0;
  (conn->response_info).http_version = (char *)0x0;
  local_50 = ebuf;
  local_48 = ebuf_len;
  local_40 = err;
  for (buflen = uVar3; 0 < (int)buflen; buflen = buflen - 1) {
    ppuVar5 = __ctype_b_loc();
    puVar6 = *ppuVar5;
    if ((*(byte *)((long)puVar6 + (ulong)*pbVar9 * 2 + 1) & 0x20) == 0) goto LAB_0011879c;
    pbVar9 = pbVar9 + 1;
  }
  if ((int)uVar3 < 0) {
    ppuVar5 = __ctype_b_loc();
    puVar6 = *ppuVar5;
    buflen = (int)uVar3 >> 0x1f & uVar3;
LAB_0011879c:
    if (((puVar6[*pbVar9] & 2) == 0) &&
       (uVar3 = get_http_header_len((char *)pbVar9,buflen), 0 < (int)uVar3)) {
      pbVar9[(ulong)uVar3 - 1] = 0;
      if (((0xd < *pbVar9) || ((0x2401U >> (*pbVar9 & 0x1f) & 1) == 0)) &&
         ((iVar2 = strncmp((char *)pbVar9,"HTTP/",5), iVar2 == 0 &&
          (endptr = (char *)(pbVar9 + 5), (short)(*ppuVar5)[pbVar9[5]] < 0)))) {
        (conn->response_info).http_version = endptr;
        iVar2 = skip_to_end_of_word_and_terminate(&endptr,0);
        pcVar10 = endptr;
        if ((0 < iVar2) &&
           ((((iVar2 = skip_to_end_of_word_and_terminate(&endptr,0), 0 < iVar2 &&
              (lVar7 = strtol(pcVar10,&local_38,10), 0xfffffffffffffc7b < lVar7 - 1000U)) &&
             ((long)local_38 - (long)pcVar10 == 3)) && (*local_38 == '\0')))) {
          (conn->response_info).status_code = (int)lVar7;
          (conn->response_info).status_text = endptr;
          pcVar10 = endptr + -1;
          do {
            bVar1 = pcVar10[1];
            pcVar10 = pcVar10 + 1;
          } while ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x40) != 0);
          if ((bVar1 == 0xd) || (bVar1 == 10)) {
            do {
              *pcVar10 = '\0';
              pbVar9 = (byte *)(pcVar10 + 1);
              pcVar10 = pcVar10 + 1;
            } while ((*(byte *)((long)*ppuVar5 + (ulong)*pbVar9 * 2 + 1) & 0x20) != 0);
            hdr = (conn->response_info).http_headers;
            endptr = pcVar10;
            iVar2 = parse_http_headers(&endptr,hdr);
            (conn->response_info).num_headers = iVar2;
            if (-1 < iVar2) {
              pcVar10 = get_header(hdr,iVar2,"Transfer-Encoding");
              if ((pcVar10 == (char *)0x0) ||
                 (iVar4 = mg_strcasecmp(pcVar10,"identity"), iVar4 == 0)) {
                pcVar10 = get_header(hdr,iVar2,"Content-Length");
                if (pcVar10 == (char *)0x0) {
                  iVar2 = (conn->response_info).status_code;
                  if (((99 < iVar2 - 100U) && (iVar2 != 0x130)) && (iVar2 != 0xcc)) {
                    conn->content_len = -1;
                    return 1;
                  }
                }
                else {
                  endptr = (char *)0x0;
                  lVar8 = strtoll(pcVar10,&endptr,10);
                  conn->content_len = lVar8;
                  if (lVar8 < 0 || endptr == pcVar10) {
                    mg_snprintf(conn,(int *)0x0,local_50,local_48,"%s","Bad request");
                    *local_40 = 0x19b;
                    return 0;
                  }
                  (conn->response_info).content_length = lVar8;
                  (conn->request_info).content_length = lVar8;
                  if ((conn->response_info).status_code != 0x130) {
                    return 1;
                  }
                }
LAB_00118a42:
                conn->content_len = 0;
                return 1;
              }
              iVar2 = mg_strcasecmp(pcVar10,"chunked");
              if (iVar2 == 0) {
                conn->is_chunked = 1;
                goto LAB_00118a42;
              }
              pcVar10 = "Bad request";
              goto LAB_001187dc;
            }
          }
        }
      }
    }
  }
  pcVar10 = "Bad response";
LAB_001187dc:
  mg_snprintf(conn,(int *)0x0,local_50,local_48,"%s",pcVar10);
  *local_40 = 400;
  return 0;
}

Assistant:

static int
get_response(struct mg_connection *conn, char *ebuf, size_t ebuf_len, int *err)
{
	const char *cl;

	conn->connection_type =
	    CONNECTION_TYPE_RESPONSE; /* response (valid or not) */

	if (!get_message(conn, ebuf, ebuf_len, err)) {
		return 0;
	}

	if (parse_http_response(conn->buf, conn->buf_size, &conn->response_info)
	    <= 0) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Bad response");
		*err = 400;
		return 0;
	}

	/* Message is a valid response */

	if (((cl = get_header(conn->response_info.http_headers,
	                      conn->response_info.num_headers,
	                      "Transfer-Encoding"))
	     != NULL)
	    && mg_strcasecmp(cl, "identity")) {
		if (mg_strcasecmp(cl, "chunked")) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Bad request");
			*err = 400;
			return 0;
		}
		conn->is_chunked = 1;
		conn->content_len = 0; /* not yet read */
	} else if ((cl = get_header(conn->response_info.http_headers,
	                            conn->response_info.num_headers,
	                            "Content-Length"))
	           != NULL) {
		char *endptr = NULL;
		conn->content_len = strtoll(cl, &endptr, 10);
		if ((endptr == cl) || (conn->content_len < 0)) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Bad request");
			*err = 411;
			return 0;
		}
		/* Publish the content length back to the response info. */
		conn->response_info.content_length = conn->content_len;

		/* TODO: check if it is still used in response_info */
		conn->request_info.content_length = conn->content_len;

		/* TODO: we should also consider HEAD method */
		if (conn->response_info.status_code == 304) {
			conn->content_len = 0;
		}
	} else {
		/* TODO: we should also consider HEAD method */
		if (((conn->response_info.status_code >= 100)
		     && (conn->response_info.status_code <= 199))
		    || (conn->response_info.status_code == 204)
		    || (conn->response_info.status_code == 304)) {
			conn->content_len = 0;
		} else {
			conn->content_len = -1; /* unknown content length */
		}
	}

	return 1;
}